

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeEstimatorUtils.h
# Opt level: O0

UnitQuaternion * expQuaternion(Vector3 omega)

{
  double *pdVar1;
  VectorFixSize<4U> *in_RDI;
  RealScalar RVar2;
  double dVar3;
  double dVar4;
  UnitQuaternion *q;
  double s;
  double c;
  double norm;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff98;
  VectorFixSize<3U> *in_stack_ffffffffffffffb8;
  
  iDynTree::VectorFixSize<4U>::VectorFixSize(in_RDI);
  iDynTree::VectorFixSize<4U>::zero(in_RDI);
  pdVar1 = iDynTree::VectorFixSize<4U>::operator()(in_RDI,0);
  *pdVar1 = 1.0;
  iDynTree::toEigen<3U>(in_stack_ffffffffffffffb8);
  RVar2 = Eigen::
          MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>::
          norm(in_stack_ffffffffffffff98);
  if ((RVar2 != 0.0) || (NAN(RVar2))) {
    dVar3 = cos(RVar2 / 2.0);
    dVar4 = sin(RVar2 / 2.0);
    dVar4 = dVar4 / RVar2;
    pdVar1 = iDynTree::VectorFixSize<4U>::operator()(in_RDI,0);
    *pdVar1 = dVar3;
    pdVar1 = iDynTree::VectorFixSize<3U>::operator()((VectorFixSize<3U> *)&stack0x00000008,0);
    dVar3 = *pdVar1;
    pdVar1 = iDynTree::VectorFixSize<4U>::operator()(in_RDI,1);
    *pdVar1 = dVar3 * dVar4;
    pdVar1 = iDynTree::VectorFixSize<3U>::operator()((VectorFixSize<3U> *)&stack0x00000008,1);
    dVar3 = *pdVar1;
    pdVar1 = iDynTree::VectorFixSize<4U>::operator()(in_RDI,2);
    *pdVar1 = dVar3 * dVar4;
    pdVar1 = iDynTree::VectorFixSize<3U>::operator()((VectorFixSize<3U> *)&stack0x00000008,2);
    dVar4 = *pdVar1 * dVar4;
    pdVar1 = iDynTree::VectorFixSize<4U>::operator()(in_RDI,3);
    *pdVar1 = dVar4;
  }
  return in_RDI;
}

Assistant:

inline iDynTree::UnitQuaternion expQuaternion(iDynTree::Vector3 omega)
{
    iDynTree::UnitQuaternion q;
    q.zero();
    q(0) = 1.0;
    using iDynTree::toEigen;
    double norm{toEigen(omega).norm()};

    if (norm == 0)
    {
        return q;
    }

    double c = std::cos(norm/2);
    double s = std::sin(norm/2)/norm;

    q(0) = c;
    q(1) = omega(0)*s;
    q(2) = omega(1)*s;
    q(3) = omega(2)*s;

    return q;
}